

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::uniform_dist<long_double>::icdf(uniform_dist<long_double> *this,result_type_conflict3 x)

{
  int *piVar1;
  result_type_conflict3 *prVar2;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  longdouble in_stack_00000008;
  
  if ((in_stack_00000008 < (longdouble)0) || ((longdouble)1 < in_stack_00000008)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    prVar2 = (result_type_conflict3 *)std::numeric_limits<long_double>::quiet_NaN();
  }
  else {
    param_type::d(in_RDI,in_RSI);
    prVar2 = param_type::a(in_RDI,in_RSI);
  }
  return prVar2;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return x * P.d() + P.a();
    }